

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scrubbers.cpp
# Opt level: O2

Scrubber *
ApprovalTests::Scrubbers::createRegexScrubber
          (Scrubber *__return_storage_ptr__,regex *regexPattern,string *replacementText)

{
  string *this;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  string local_38 [32];
  
  ::std::__cxx11::string::string(local_38,(string *)replacementText);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  this = (string *)operator_new(0x20);
  ::std::__cxx11::string::string(this,local_38);
  pcStack_40 = ::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/scrubbers/Scrubbers.cpp:47:31)>
               ::_M_invoke;
  local_48 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/scrubbers/Scrubbers.cpp:47:31)>
             ::_M_manager;
  local_58._M_unused._0_8_ = (undefined8)this;
  createRegexScrubber(__return_storage_ptr__,regexPattern,(RegexReplacer *)&local_58);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
  ::std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

Scrubber createRegexScrubber(const std::regex& regexPattern,
                                     const std::string& replacementText)
        {
            return createRegexScrubber(
                regexPattern, [=](const RegexMatch&) { return replacementText; });
        }